

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O1

TVariableType __thiscall
Refal2::CVariablesBuilder::checkTypeTag
          (CVariablesBuilder *this,TVariableTypeTag type,CQualifier **defaultQualifierForTag)

{
  int iVar1;
  long *plVar2;
  CQualifier *pCVar3;
  long *plVar4;
  size_type *psVar5;
  char *replacement;
  TVariableType TVar6;
  char type_00;
  undefined7 in_register_00000031;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 local_218 [56];
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_1e0;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_1b0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_178;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_148;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_118;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_e0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_b0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_80;
  
  TVar6 = VT_S;
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 < 0x65) {
    switch(iVar1) {
    case 0x4e:
switchD_001332c5_caseD_4e:
      if (defaultQualifierForTag != (CQualifier **)0x0) {
        if ((getDefaultQualifierForN()::qualifier == '\0') &&
           (iVar1 = __cxa_guard_acquire(&getDefaultQualifierForN()::qualifier), iVar1 != 0)) {
          pCVar3 = (CQualifier *)operator_new(0x48);
          CQualifier::CQualifier(pCVar3);
          getDefaultQualifierForN()::qualifier = pCVar3;
          __cxa_guard_release(&getDefaultQualifierForN()::qualifier);
        }
        if (getDefaultQualifierForN()::qualifier == (CQualifier *)0x0) {
          CQualifierBuilder::CQualifierBuilder((CQualifierBuilder *)local_218);
          CQualifierBuilder::AddN((CQualifierBuilder *)local_218);
          local_218._0_8_ = local_218._0_8_ ^ 1;
          CQualifierBuilder::Export
                    ((CQualifierBuilder *)local_218,getDefaultQualifierForN()::qualifier);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_80);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_b0);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_e0);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_118);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_148);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_178);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree(&local_1b0);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree(&local_1e0);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)(local_218 + 8));
        }
        *defaultQualifierForTag = getDefaultQualifierForN()::qualifier;
      }
      replacement = "s(N)_";
      type_00 = 'n';
      break;
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
      goto switchD_001332c5_caseD_4f;
    case 0x53:
      goto switchD_001332c5_caseD_53;
    case 0x56:
switchD_001332c5_caseD_53:
      return VT_V;
    case 0x57:
switchD_001332c5_caseD_53:
      return VT_W;
    default:
      if (iVar1 == 0x45) {
        return VT_E;
      }
      if (iVar1 != 0x46) goto switchD_001332c5_caseD_4f;
LAB_00133447:
      if (defaultQualifierForTag != (CQualifier **)0x0) {
        if ((getDefaultQualifierForF()::qualifier == '\0') &&
           (iVar1 = __cxa_guard_acquire(&getDefaultQualifierForF()::qualifier), iVar1 != 0)) {
          pCVar3 = (CQualifier *)operator_new(0x48);
          CQualifier::CQualifier(pCVar3);
          getDefaultQualifierForF()::qualifier = pCVar3;
          __cxa_guard_release(&getDefaultQualifierForF()::qualifier);
        }
        if (getDefaultQualifierForF()::qualifier == (CQualifier *)0x0) {
          CQualifierBuilder::CQualifierBuilder((CQualifierBuilder *)local_218);
          CQualifierBuilder::AddF((CQualifierBuilder *)local_218);
          local_218._0_8_ = local_218._0_8_ ^ 1;
          CQualifierBuilder::Export
                    ((CQualifierBuilder *)local_218,getDefaultQualifierForF()::qualifier);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_80);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_b0);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_e0);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_118);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_148);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_178);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree(&local_1b0);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree(&local_1e0);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)(local_218 + 8));
        }
        *defaultQualifierForTag = getDefaultQualifierForF()::qualifier;
      }
      replacement = "s(F)_";
      type_00 = 'f';
    }
    warningObsoleteVariableType(this,type_00,replacement);
  }
  else {
    switch(iVar1) {
    case 0x6e:
      goto switchD_001332c5_caseD_4e;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
      break;
    case 0x73:
      goto switchD_001332c5_caseD_53;
    case 0x76:
      goto switchD_001332c5_caseD_53;
    case 0x77:
      goto switchD_001332c5_caseD_53;
    default:
      if (iVar1 == 0x65) {
        return VT_E;
      }
      if (iVar1 == 0x66) goto LAB_00133447;
    }
switchD_001332c5_caseD_4f:
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct((ulong)local_238,'\x01');
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0x13b541);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_248 = *plVar4;
      lStack_240 = plVar2[3];
      local_258 = &local_248;
    }
    else {
      local_248 = *plVar4;
      local_258 = (long *)*plVar2;
    }
    local_250 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_258);
    psVar5 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar5) {
      local_218._16_8_ = *psVar5;
      local_218._24_8_ = plVar2[3];
      local_218._0_8_ = local_218 + 0x10;
    }
    else {
      local_218._16_8_ = *psVar5;
      local_218._0_8_ = (size_type *)*plVar2;
    }
    local_218._8_8_ = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    CErrorsHelper::RaiseError(&this->super_CErrorsHelper,ES_Error,(string *)local_218);
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_);
    }
    if (local_258 != &local_248) {
      operator_delete(local_258);
    }
    if (local_238[0] != local_228) {
      operator_delete(local_238[0]);
    }
    TVar6 = VT_None;
  }
switchD_001332c5_caseD_53:
  return TVar6;
}

Assistant:

TVariableType CVariablesBuilder::checkTypeTag( const TVariableTypeTag type,
	const CQualifier** defaultQualifierForTag )
{
	switch( type ) {
		case 's':
		case 'S':
			return VT_S;
		case 'w':
		case 'W':
			return VT_W;
		case 'v':
		case 'V':
			return VT_V;
		case 'e':
		case 'E':
			return VT_E;
		case 'n':
		case 'N':
			if( defaultQualifierForTag != nullptr ) {
				*defaultQualifierForTag = getDefaultQualifierForN();
			}
			warningObsoleteVariableType( 'n', "s(N)_" );
			return VT_S;
		case 'f':
		case 'F':
			if( defaultQualifierForTag != nullptr ) {
				*defaultQualifierForTag = getDefaultQualifierForF();
			}
			warningObsoleteVariableType( 'f', "s(F)_" );
			return VT_S;
	}
	error( "variable type `"
		+ std::string( 1, static_cast<char>( type ) )
		+ "` doesn't exist, allowed variables types: `s`, `w`, `v` or `e`" );
	return VT_None;
}